

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQUnsignedInteger sq_getrefcount(HSQUIRRELVM v,HSQOBJECT *po)

{
  uint *in_RSI;
  SQObject *in_stack_fffffffffffffff8;
  SQUnsignedInteger SVar1;
  
  if ((*in_RSI & 0x8000000) == 0) {
    SVar1 = 0;
  }
  else {
    SVar1 = RefTable::GetRefCount((RefTable *)po,in_stack_fffffffffffffff8);
  }
  return SVar1;
}

Assistant:

SQUnsignedInteger sq_getrefcount(HSQUIRRELVM v,HSQOBJECT *po)
{
    if(!ISREFCOUNTED(sq_type(*po))) return 0;
#ifdef NO_GARBAGE_COLLECTOR
   return po->_unVal.pRefCounted->_uiRef;
#else
   return _ss(v)->_refs_table.GetRefCount(*po);
#endif
}